

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * Extra_bddReduceVarSet(DdManager *dd,DdNode *bVars,DdNode *bF)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *bF_local;
  DdNode *bVars_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraBddReduceVarSet(dd,bVars,bF);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_bddReduceVarSet( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVars,    /* the set of variables to be reduced */
  DdNode * bF)       /* the function whose support is used for reduction */
{
    DdNode * res;
    do {
        dd->reordered = 0;
        res = extraBddReduceVarSet( dd, bVars, bF );
    } while (dd->reordered == 1);
    return(res);

}